

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

bool slang::caseXWildcardEqual(SVInt *lhs,SVInt *rhs)

{
  bool bVar1;
  uint uVar2;
  SVInt *pSVar3;
  SVInt *pSVar4;
  bool bVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_28;
  uint local_20;
  byte local_1b;
  
  bVar5 = (lhs->super_SVIntStorage).unknownFlag;
  if ((bVar5 == false) && ((rhs->super_SVIntStorage).unknownFlag == false)) {
    bVar5 = exactlyEqual(lhs,rhs);
    return bVar5;
  }
  uVar2 = (lhs->super_SVIntStorage).bitWidth;
  uVar8 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar2 == uVar8) {
    bVar11 = true;
    if (0x3f < uVar2 + 0x3f) {
      uVar8 = uVar2 + 0x3f >> 6;
      pSVar3 = (SVInt *)(lhs->super_SVIntStorage).field_0.val;
      bVar1 = (rhs->super_SVIntStorage).unknownFlag;
      if (bVar5 != false) {
        lhs = pSVar3;
      }
      pSVar4 = (SVInt *)(rhs->super_SVIntStorage).field_0.val;
      if (bVar1 != false) {
        rhs = pSVar4;
      }
      if (0x40 < uVar2) {
        rhs = pSVar4;
        lhs = pSVar3;
      }
      uVar7 = (ulong)(uVar8 << 3);
      lVar9 = 0;
      do {
        uVar10 = 0xffffffffffffffff;
        if (bVar5 != false) {
          uVar10 = ~*(ulong *)((long)&(pSVar3->super_SVIntStorage).field_0 + lVar9 * 8 + uVar7);
        }
        if (bVar1 != false) {
          uVar10 = uVar10 & ~*(ulong *)((long)&(pSVar4->super_SVIntStorage).field_0 +
                                       lVar9 * 8 + uVar7);
        }
        bVar11 = (((&(rhs->super_SVIntStorage).field_0)[lVar9].val ^
                  (&(lhs->super_SVIntStorage).field_0)[lVar9].val) & uVar10) == 0;
      } while ((bVar11) && (bVar12 = (ulong)uVar8 - 1 != lVar9, lVar9 = lVar9 + 1, bVar12));
    }
  }
  else {
    bVar6 = (rhs->super_SVIntStorage).signFlag & (lhs->super_SVIntStorage).signFlag;
    if (uVar2 < uVar8) {
      if (bVar6 == 0) {
        SVInt::zext((SVInt *)&local_28,(bitwidth_t)lhs);
      }
      else {
        SVInt::sext((SVInt *)&local_28,(bitwidth_t)lhs);
      }
      bVar11 = caseXWildcardEqual((SVInt *)&local_28,rhs);
    }
    else {
      if (bVar6 == 0) {
        SVInt::zext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      else {
        SVInt::sext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      bVar11 = caseXWildcardEqual(lhs,(SVInt *)&local_28);
    }
    if (((0x40 < local_20) || ((local_1b & 1) != 0)) && ((void *)local_28.val != (void *)0x0)) {
      operator_delete__(local_28.pVal);
    }
  }
  return bVar11;
}

Assistant:

bool caseXWildcardEqual(const SVInt& lhs, const SVInt& rhs) {
    // if no unknown flags, do normal comparison
    if (!lhs.unknownFlag && !rhs.unknownFlag)
        return exactlyEqual(lhs, rhs);

    // handle sign extension if necessary
    if (lhs.bitWidth != rhs.bitWidth) {
        bool bothSigned = lhs.signFlag && rhs.signFlag;
        if (lhs.bitWidth < rhs.bitWidth)
            return caseXWildcardEqual(lhs.extend(rhs.bitWidth, bothSigned), rhs);
        else
            return caseXWildcardEqual(lhs, rhs.extend(lhs.bitWidth, bothSigned));
    }

    uint32_t words = SVInt::getNumWords(rhs.bitWidth, false);
    for (uint32_t i = 0; i < words; ++i) {
        // bitmask to avoid comparing the unknown bits on either side
        uint64_t mask = UINT64_MAX;
        if (lhs.unknownFlag)
            mask &= ~lhs.pVal[i + words];
        if (rhs.unknownFlag)
            mask &= ~rhs.pVal[i + words];

        if ((lhs.getRawData()[i] & mask) != (rhs.getRawData()[i] & mask))
            return false;
    }

    return true;
}